

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

int __thiscall
booster::aio::stream_socket::connect(stream_socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  native_type __fd_00;
  int iVar1;
  int *piVar2;
  undefined4 in_register_00000034;
  pair<const_sockaddr_*,_int> pVar3;
  error_code eVar4;
  
  pVar3 = endpoint::raw((endpoint *)CONCAT44(in_register_00000034,__fd));
  do {
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    iVar1 = ::connect(__fd_00,(sockaddr *)pVar3.first,pVar3.second);
    if (-1 < iVar1) {
      return iVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  eVar4 = socket_details::geterror();
  iVar1 = eVar4._M_value;
  __addr->sa_family = (short)iVar1;
  __addr->sa_data[0] = (char)((uint)iVar1 >> 0x10);
  __addr->sa_data[1] = (char)((uint)iVar1 >> 0x18);
  *(error_category **)(__addr->sa_data + 6) = eVar4._M_cat;
  return iVar1;
}

Assistant:

void stream_socket::connect(endpoint const &ep,system::error_code &e)
{
	endpoint::native_address_type address = ep.raw();
	#ifndef BOOSTER_WIN32
	for(;;) {
		int res = ::connect(native(),address.first,address.second);
		if(res < 0 && errno==EINTR)
			continue;
		if(res < 0) {
			e=geterror();
			return;
		}
		break;
	}
	#else
	if(::connect(native(),address.first,address.second) < 0)
		e=geterror();
	#endif
}